

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hh
# Opt level: O2

void __thiscall
Variant<int,std::__cxx11::string,char_const*>::Variant<std::__cxx11::string,void>
          (Variant<int,std::__cxx11::string,char_const*> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  *(undefined **)(this + 0x20) = &void::typeinfo;
  Variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::destroy((Variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
             *)this,(type_index *)(this + 0x20),this);
  std::__cxx11::string::string((string *)this,(string *)value);
  *(pointer_____offset_0x10___ **)(this + 0x20) = &std::__cxx11::string::typeinfo;
  return;
}

Assistant:

Variant(T&& value) : type_index_(typeid(void))
	{
			destroy(type_index_, &data_);
			typedef typename std::decay<T>::type U;
			new(&data_) U(std::forward<T>(value));
			type_index_ = std::type_index(typeid(U));
	}